

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O0

void __thiscall SuffixTree::GeneralizedSuffixTree::IncActiveLength(GeneralizedSuffixTree *this)

{
  mapped_type *pmVar1;
  Edge *edge;
  GeneralizedSuffixTree *this_local;
  
  this->active_length = this->active_length + 1;
  pmVar1 = std::
           unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
           ::operator[](&this->active_node->edges,&this->active_edge);
  if ((pmVar1->length != 0) && (this->active_length == pmVar1->length)) {
    this->active_node = (Node *)pmVar1->field_0;
    this->active_length = 0;
  }
  return;
}

Assistant:

void GeneralizedSuffixTree::IncActiveLength()
{
	++active_length;
	Edge &edge = active_node->edges[active_edge];
	if (edge.length && active_length == edge.length)
	{
		active_node = edge.node;
		active_length = 0;
	}
}